

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
Heap_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *nonZeroRowIndices,Dimension dimension,Column_settings *colSettings)

{
  pointer ppVar1;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar2;
  uint uVar3;
  ulong uVar4;
  pointer ppVar5;
  allocator_type local_31;
  value_type local_30;
  
  *(Dimension *)this = dimension;
  ppVar5 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 == ppVar1) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = ppVar1[-1].first;
  }
  *(uint *)(this + 4) = uVar3;
  *(undefined4 *)(this + 8) = 0xffffffff;
  local_30 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
            *)(this + 0x10),(long)ppVar1 - (long)ppVar5 >> 3,&local_30,&local_31);
  *(undefined4 *)(this + 0x28) = 0;
  *(undefined1 **)(this + 0x38) = &colSettings->field_0x20;
  *(Column_settings **)(this + 0x30) = colSettings;
  ppVar1 = (nonZeroRowIndices->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  for (ppVar5 = (nonZeroRowIndices->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    pEVar2 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
             ::construct<unsigned_int_const&>
                       (*(New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>
                          **)(this + 0x38),&ppVar5->first);
    *(Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      **)(*(long *)(this + 0x10) + uVar4 * 8) = pEVar2;
    uVar3 = ppVar5->second;
    if (**(uint **)(this + 0x30) <= uVar3) {
      uVar3 = uVar3 % **(uint **)(this + 0x30);
    }
    **(uint **)(*(long *)(this + 0x10) + uVar4 * 8) = uVar3;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  std::
  make_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>
            (*(undefined8 *)(this + 0x10),*(undefined8 *)(this + 0x18));
  return;
}

Assistant:

inline Heap_column<Master_matrix>::Heap_column(const Container& nonZeroRowIndices,
                                               Dimension dimension,
                                               Column_settings* colSettings)
    : Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      insertsSinceLastPrune_(0),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      column_[i++] = entryPool_->construct(id);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      column_[i] = entryPool_->construct(p.first);
      column_[i++]->set_element(operators_->get_value(p.second));
    }
  }
  std::make_heap(column_.begin(), column_.end(), entryPointerComp_);
}